

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Federate.cpp
# Opt level: O0

CloningFilter * __thiscall
helics::Federate::registerCloningFilter
          (Federate *this,string_view filterName,string_view inputType,string_view outputType)

{
  string_view addition;
  CloningFilter *pCVar1;
  unique_ptr<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>,_std::default_delete<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_>_>
  in_stack_00000060;
  undefined1 in_stack_00000068 [16];
  undefined1 in_stack_00000078 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  in_stack_00000090;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  Federate *this_01;
  size_t in_stack_ffffffffffffff60;
  char *in_stack_ffffffffffffff68;
  
  this_01 = (Federate *)&stack0x00000008;
  std::
  unique_ptr<helics::ConnectorFederateManager,_std::default_delete<helics::ConnectorFederateManager>_>
  ::operator->((unique_ptr<helics::ConnectorFederateManager,_std::default_delete<helics::ConnectorFederateManager>_>
                *)0x3528c2);
  addition._M_str = in_stack_ffffffffffffff68;
  addition._M_len = in_stack_ffffffffffffff60;
  localNameGenerator_abi_cxx11_(this_01,addition);
  std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_ffffffffffffff30);
  this_00 = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
             &this_01->currentMode;
  pCVar1 = ConnectorFederateManager::registerCloningFilter
                     ((ConnectorFederateManager *)
                      in_stack_00000060._M_t.
                      super___uniq_ptr_impl<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>,_std::default_delete<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_*,_std::default_delete<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_>_>
                      .
                      super__Head_base<0UL,_gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_*,_false>
                      ._M_head_impl,(string_view)in_stack_00000078,(string_view)in_stack_00000068,
                      (string_view)in_stack_00000090);
  std::__cxx11::string::~string(this_00);
  return pCVar1;
}

Assistant:

CloningFilter& Federate::registerCloningFilter(std::string_view filterName,
                                               std::string_view inputType,
                                               std::string_view outputType)
{
    return cManager->registerCloningFilter(localNameGenerator(filterName), inputType, outputType);
}